

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O2

void __thiscall ixxx::ansi::env::test_method(env *this)

{
  char *__s;
  undefined1 local_82;
  undefined1 local_81;
  string s;
  char *local_60;
  char *local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  char *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  
  __s = getenv("PATH");
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,__s,(allocator<char> *)&local_50);
  local_20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_18 = "";
  local_30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_28 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_20,0x71);
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_00121818;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_81 = s._M_string_length == 0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_58 = "";
  local_82 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_50,&local_60,0x71,1,2,&local_81,"s.empty()",&local_82,"false");
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( env )
    {
      string s(ansi::getenv("PATH"));
      BOOST_CHECK_EQUAL(s.empty(), false);
    }